

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O2

void __thiscall
ReleaseSite::ReleaseSite
          (ReleaseSite *this,string *name,int start,int stop,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *interactions)

{
  _Base_ptr p_Var1;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  FixedElement::FixedElement(&this->super_FixedElement,name,start,stop,interactions);
  (this->super_FixedElement)._vptr_FixedElement = (_func_int **)&PTR__FixedElement_0019d5f0;
  *(undefined2 *)&(this->super_FixedElement).first_exposure_ = 0;
  p_Var1 = (interactions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(interactions->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    if ((*(double *)(p_Var1 + 2) < 0.0) || (1.0 < *(double *)(p_Var1 + 2))) break;
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1);
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"Release site \'",&(this->super_FixedElement).name_);
  std::operator+(&local_40,&local_60,"\' must have efficiency values between 0.0 and 1.0.");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ReleaseSite::ReleaseSite(const std::string &name, int start, int stop,
                         const std::map<std::string, double> &interactions)
    : FixedElement(name, start, stop, interactions) {
  first_exposure_ = false;
  readthrough_ = false;
  for (auto const &item : interactions) {
    if (item.second < 0 || item.second > 1) {
      throw std::invalid_argument(
          "Release site '" + name_ +
          "' must have efficiency values between 0.0 and 1.0.");
    }
  }
}